

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

iterator __thiscall
fmt::v5::internal::arg_formatter_base<fmt::v5::output_range<char_*,_char>_>::operator()
          (arg_formatter_base<fmt::v5::output_range<char_*,_char>_> *this,
          basic_string_view<char> value)

{
  iterator __dest;
  size_t __n;
  char **it;
  iterator pcVar1;
  ptrdiff_t _Num;
  error_handler local_21;
  
  __n = value.size_;
  if (this->specs_ == (format_specs *)0x0) {
    __dest = (this->writer_).out_;
    if (__n != 0) {
      memmove(__dest,value.data_,__n);
    }
    pcVar1 = __dest + __n;
    (this->writer_).out_ = pcVar1;
  }
  else {
    check_string_type_spec<char,fmt::v5::internal::error_handler>
              ((this->specs_->super_core_format_specs).type,&local_21);
    basic_writer<fmt::v5::output_range<char_*,_char>_>::write<char>
              (&this->writer_,value,this->specs_);
    pcVar1 = (this->writer_).out_;
  }
  return pcVar1;
}

Assistant:

iterator operator()(basic_string_view<char_type> value) {
    if (specs_) {
      internal::check_string_type_spec(
            specs_->type, internal::error_handler());
      writer_.write(value, *specs_);
    } else {
      writer_.write(value);
    }
    return out();
  }